

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglengineshadermanager.cpp
# Opt level: O1

void __thiscall QOpenGLEngineShaderManager::useSimpleProgram(QOpenGLEngineShaderManager *this)

{
  long lVar1;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  
  QOpenGLShaderProgram::bind
            (*(QOpenGLShaderProgram **)(*(long *)(this + 0x10) + 8),in_ESI,in_RDX,in_ECX);
  lVar1 = *(long *)(*(long *)(*(long *)(this + 0x18) + 8) + 0x100);
  QOpenGL2PaintEngineExPrivate::setVertexAttribArrayEnabled
            (*(QOpenGL2PaintEngineExPrivate **)(lVar1 + 0x18),0,true);
  QOpenGL2PaintEngineExPrivate::setVertexAttribArrayEnabled
            (*(QOpenGL2PaintEngineExPrivate **)(lVar1 + 0x18),1,false);
  QOpenGL2PaintEngineExPrivate::setVertexAttribArrayEnabled
            (*(QOpenGL2PaintEngineExPrivate **)(lVar1 + 0x18),2,false);
  this[0x20] = (QOpenGLEngineShaderManager)0x1;
  return;
}

Assistant:

void QOpenGLEngineShaderManager::useSimpleProgram()
{
    sharedShaders->simpleProgram()->bind();
    QOpenGLContextPrivate* ctx_d = ctx->d_func();
    Q_UNUSED(ctx_d);

    QOpenGL2PaintEngineEx *active_engine = static_cast<QOpenGL2PaintEngineEx *>(ctx_d->active_engine);

    active_engine->d_func()->setVertexAttribArrayEnabled(QT_VERTEX_COORDS_ATTR, true);
    active_engine->d_func()->setVertexAttribArrayEnabled(QT_TEXTURE_COORDS_ATTR, false);
    active_engine->d_func()->setVertexAttribArrayEnabled(QT_OPACITY_ATTR, false);

    shaderProgNeedsChanging = true;
}